

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_ironlich.cpp
# Opt level: O2

int AF_A_LichFireGrow(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  int *piVar1;
  int iVar2;
  VM_UBYTE VVar3;
  DObject *this;
  bool bVar4;
  AActor *pAVar5;
  FState *newstate;
  AActor *this_00;
  char *__assertion;
  FName local_1c;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0052eb88;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    this_00 = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (this_00 == (AActor *)0x0) {
LAB_0052ea91:
        this_00 = (AActor *)0x0;
      }
      else {
        bVar4 = DObject::IsKindOf((DObject *)this_00,AActor::RegistrationInfo.MyClass);
        if (!bVar4) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0052eb88;
        }
      }
      if (numparam == 1) goto LAB_0052eb11;
      VVar3 = param[1].field_0.field_3.Type;
      if (VVar3 != 0xff) {
        if (VVar3 != '\x03') goto LAB_0052eb78;
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar4 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar4) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_0052eb88;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_0052eb78;
      }
      if ((((uint)numparam < 3) || (VVar3 = param[2].field_0.field_3.Type, VVar3 == 0xff)) ||
         ((VVar3 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_0052eb11:
        piVar1 = &this_00->health;
        *piVar1 = *piVar1 + -1;
        iVar2 = *piVar1;
        (this_00->__Pos).Z = (this_00->__Pos).Z + 9.0;
        if (iVar2 == 0) {
          pAVar5 = AActor::GetDefault(this_00);
          this_00->Damage = pAVar5->Damage;
          FName::FName(&local_1c,"NoGrow");
          newstate = AActor::FindState(this_00,&local_1c);
          AActor::SetState(this_00,newstate,false);
        }
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_0052eb88;
    }
    if (this_00 == (AActor *)0x0) goto LAB_0052ea91;
  }
LAB_0052eb78:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_0052eb88:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_heretic/a_ironlich.cpp"
                ,0xca,"int AF_A_LichFireGrow(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_LichFireGrow)
{
	PARAM_ACTION_PROLOGUE;

	self->health--;
	self->AddZ(9.);
	if (self->health == 0)
	{
		self->Damage = self->GetDefault()->Damage;
		self->SetState (self->FindState("NoGrow"));
	}
	return 0;
}